

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::average_down
          (NavierStokesBase *this,MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp)

{
  IntVect *in_stack_000007f8;
  int in_stack_00000800;
  int in_stack_00000804;
  MultiFab *in_stack_00000808;
  MultiFab *in_stack_00000810;
  
  amrex::EB_average_down
            (in_stack_00000810,in_stack_00000808,in_stack_00000804,in_stack_00000800,
             in_stack_000007f8);
  return;
}

Assistant:

void
NavierStokesBase::average_down(const MultiFab& S_fine, MultiFab& S_crse,
                               int scomp, int ncomp)
{
  //
  // Choose the appropriate AMReX average_down() based on
  // whether EB or non-EB, and dimensionality
  //

#ifdef AMREX_USE_EB
  //
  // FIXME?
  // Assume we want EB to behave the same as non-EB in regards to dimensionality
  // Note that 3D volume weighting doesn't exist for non-EB
  //
#if (AMREX_SPACEDIM == 3)
    // no volume weighting
    amrex::EB_average_down(S_fine, S_crse, scomp, ncomp, fine_ratio);
#else
    // volume weighting
    amrex::EB_average_down(S_fine, S_crse, this->getLevel(level+1).Volume(),
                           *(this->getLevel(level+1).VolFrac()),
                           scomp, ncomp, fine_ratio);
#endif

#else
    //
    // non-EB aware, uses volume weighting for 1D,2D but no volume weighting for 3D
    //
    amrex::average_down(S_fine, S_crse,
                        this->getLevel(level+1).geom, this->getLevel(level).geom,
                        scomp, ncomp, fine_ratio);
#endif
}